

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactoryTests.cpp
# Opt level: O0

void verifyFindingReportersByName
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *inputs,string *osPrefix)

{
  ReporterFactory reporterFactory;
  Options *this;
  anon_class_16_2_9d7f8244 *in_stack_fffffffffffffee8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
  *in_stack_fffffffffffffef0;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  Options *options;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
  *converter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list;
  string *header;
  undefined1 local_61 [97];
  
  ApprovalTests::ReporterFactory::ReporterFactory((ReporterFactory *)0x1d51c4);
  this = (Options *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::function<void(std::__cxx11::string,std::ostream&)>::
  function<verifyFindingReportersByName(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&)::__0,void>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  list = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
  header = (string *)0x0;
  options = (Options *)0x0;
  converter = (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
               *)0x0;
  ApprovalTests::Options::Options((Options *)0x0);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  verifyAll<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (header,list,converter,options);
  ApprovalTests::Options::~Options(this);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
  ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
               *)0x1d529f);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  ApprovalTests::ReporterFactory::~ReporterFactory((ReporterFactory *)0x1d52c6);
  return;
}

Assistant:

void verifyFindingReportersByName(const std::vector<std::string>& inputs,
                                  const std::string& osPrefix)
{
    ReporterFactory reporterFactory;

    Approvals::verifyAll("", inputs, [&](auto input, auto& stream) {
        stream << input << " => " << reporterFactory.findReporterName(osPrefix, input);
    });
}